

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlLookupCharEncodingHandler(xmlCharEncoding enc,xmlCharEncodingHandler **out)

{
  char *norig;
  int iVar1;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    return 0x73;
  }
  *out = (xmlCharEncodingHandler *)0x0;
  iVar1 = 0x20;
  if ((0xffffffe1 < (uint)(enc + ~XML_CHAR_ENCODING_8859_16)) &&
     (iVar1 = 0, enc != XML_CHAR_ENCODING_UTF8)) {
    if ((defaultHandlers[enc].input != (xmlCharEncodingInputFunc)0x0) ||
       (defaultHandlers[enc].output != (xmlCharEncodingOutputFunc)0x0)) {
      *out = defaultHandlers + enc;
      return iVar1;
    }
    norig = defaultHandlers[enc].name;
    iVar1 = 0x20;
    if (norig != (char *)0x0) {
      iVar1 = xmlFindExtraHandler(norig,norig,0,(xmlCharEncConvImpl)0x0,(void *)0x0,out);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlLookupCharEncodingHandler(xmlCharEncoding enc,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((enc <= 0) || ((size_t) enc >= NUM_DEFAULT_HANDLERS))
        return(XML_ERR_UNSUPPORTED_ENCODING);

    /* Return NULL handler for UTF-8 */
    if ((enc == XML_CHAR_ENCODING_UTF8) ||
        (enc == XML_CHAR_ENCODING_NONE))
        return(XML_ERR_OK);

    handler = &defaultHandlers[enc];
    if ((handler->input != NULL) || (handler->output != NULL)) {
        *out = (xmlCharEncodingHandler *) handler;
        return(XML_ERR_OK);
    }

    if (handler->name != NULL)
        return(xmlFindExtraHandler(handler->name, handler->name, 0,
                                   NULL, NULL, out));

    return(XML_ERR_UNSUPPORTED_ENCODING);
}